

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O3

vector<unsigned_long,_true> *
duckdb::SubgraphsConnectedByEdge
          (vector<unsigned_long,_true> *__return_storage_ptr__,FilterInfoWithTotalDomains *edge,
          vector<duckdb::Subgraph2Denominator,_true> *subgraphs)

{
  bool bVar1;
  pointer pSVar2;
  unsigned_long *puVar3;
  pointer pSVar4;
  ulong uVar5;
  ulong uVar6;
  iterator iVar7;
  ulong uVar8;
  unsigned_long local_38;
  ulong local_30;
  
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pSVar2 = (subgraphs->
           super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
           ).
           super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = (subgraphs->
           super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
           ).
           super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar2 != pSVar4) {
    local_38 = 0;
    do {
      local_30 = local_38 + 1;
      uVar5 = ((long)pSVar4 - (long)pSVar2 >> 3) * -0x5555555555555555;
      if (local_30 != uVar5) {
        do {
          uVar8 = local_38;
          if (uVar5 <= local_38) {
LAB_00cfea31:
            ::std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar8);
          }
          bVar1 = EdgeConnects(edge,pSVar2 + local_38);
          uVar5 = local_30;
          if (bVar1) {
            pSVar2 = (subgraphs->
                     super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     ).
                     super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar6 = ((long)(subgraphs->
                           super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                           ).
                           super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) *
                    -0x5555555555555555;
            uVar8 = local_30;
            if (uVar6 < local_30 || uVar6 - local_30 == 0) goto LAB_00cfea31;
            bVar1 = EdgeConnects(edge,pSVar2 + local_30);
            if (bVar1) {
              iVar7._M_current =
                   (__return_storage_ptr__->
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar3 = (__return_storage_ptr__->
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              if (iVar7._M_current == puVar3) {
                ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                           __return_storage_ptr__,iVar7,&local_38);
                iVar7._M_current =
                     (__return_storage_ptr__->
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                puVar3 = (__return_storage_ptr__->
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              }
              else {
                *iVar7._M_current = local_38;
                iVar7._M_current = iVar7._M_current + 1;
                (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                ).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar7._M_current;
              }
              if (iVar7._M_current == puVar3) {
                ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                           __return_storage_ptr__,iVar7,&local_30);
                return __return_storage_ptr__;
              }
              *iVar7._M_current = uVar5;
              goto LAB_00cfe9e9;
            }
          }
          local_30 = uVar5 + 1;
          pSVar2 = (subgraphs->
                   super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ).
                   super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = ((long)(subgraphs->
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         ).
                         super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) *
                  -0x5555555555555555;
        } while (local_30 != uVar5);
      }
      if (uVar5 <= local_38) {
        ::std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      bVar1 = EdgeConnects(edge,pSVar2 + local_38);
      if (bVar1) {
        iVar7._M_current =
             (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                     iVar7,&local_38);
          return __return_storage_ptr__;
        }
        *iVar7._M_current = local_38;
LAB_00cfe9e9:
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        return __return_storage_ptr__;
      }
      local_38 = local_38 + 1;
      pSVar2 = (subgraphs->
               super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ).
               super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar4 = (subgraphs->
               super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ).
               super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (local_38 != ((long)pSVar4 - (long)pSVar2 >> 3) * -0x5555555555555555);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<idx_t> SubgraphsConnectedByEdge(FilterInfoWithTotalDomains &edge, vector<Subgraph2Denominator> &subgraphs) {
	vector<idx_t> res;
	if (subgraphs.empty()) {
		return res;
	} else {
		// check the combinations of subgraphs and see if the edge connects two of them,
		// if so, return the indexes of the two subgraphs within the vector
		for (idx_t outer = 0; outer != subgraphs.size(); outer++) {
			// check if the edge connects two subgraphs.
			for (idx_t inner = outer + 1; inner != subgraphs.size(); inner++) {
				if (EdgeConnects(edge, subgraphs.at(outer)) && EdgeConnects(edge, subgraphs.at(inner))) {
					// order is important because we will delete the inner subgraph later
					res.push_back(outer);
					res.push_back(inner);
					return res;
				}
			}
			// if the edge does not connect two subgraphs, see if the edge connects with just outer
			// merge subgraph.at(outer) with the RelationSet(s) that edge connects
			if (EdgeConnects(edge, subgraphs.at(outer))) {
				res.push_back(outer);
				return res;
			}
		}
	}
	// this edge connects only the relations it connects. Return an empty result so a new subgraph is created.
	return res;
}